

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O1

void __thiscall ctemplate::TemplateCache::~TemplateCache(TemplateCache *this)

{
  _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  _Hashtable<ctemplate::TemplateCache::RefcountedTemplate_*,_std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_ctemplate::TemplateCache::RefTplPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  Mutex *pMVar1;
  
  ClearCache(this);
  this_00 = &this->parsed_template_cache_->_M_h;
  if (this_00 !=
      (_Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)0x0) {
    std::
    _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(this_00);
    operator_delete(this_00);
  }
  this_01 = &this->get_template_calls_->_M_h;
  if (this_01 !=
      (_Hashtable<ctemplate::TemplateCache::RefcountedTemplate_*,_std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_ctemplate::TemplateCache::RefTplPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)0x0) {
    std::
    _Hashtable<ctemplate::TemplateCache::RefcountedTemplate_*,_std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_ctemplate::TemplateCache::RefTplPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(this_01);
    operator_delete(this_01);
  }
  pMVar1 = this->mutex_;
  if (pMVar1 != (Mutex *)0x0) {
    if (pMVar1->mutex_ != 0) goto LAB_00121184;
    operator_delete(pMVar1);
  }
  pMVar1 = this->search_path_mutex_;
  if (pMVar1 != (Mutex *)0x0) {
    if (pMVar1->mutex_ != 0) {
LAB_00121184:
      __assert_fail("mutex_ == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                    ,0xe9,"ctemplate::Mutex::~Mutex()");
    }
    operator_delete(pMVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->search_path_);
  return;
}

Assistant:

TemplateCache::~TemplateCache() {
  ClearCache();
  delete parsed_template_cache_;
  delete get_template_calls_;
  delete mutex_;
  delete search_path_mutex_;
}